

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool build_large(chunk *c,loc_conflict centre,wchar_t rating)

{
  _Bool _Var1;
  uint32_t uVar2;
  loc_conflict lVar3;
  loc grid;
  loc_conflict grid_00;
  wchar_t wVar4;
  int iVar5;
  wchar_t wVar6;
  int iVar7;
  wchar_t wVar8;
  wchar_t y1;
  wchar_t wVar9;
  wchar_t wVar10;
  uint uVar11;
  uint uVar12;
  wchar_t flag;
  loc_conflict centre_local;
  
  wVar4 = c->depth;
  centre_local = centre;
  uVar2 = Rand_div(0x19);
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,L'\v',L'\x19');
  wVar9 = centre.y;
  if ((c->height <= wVar9) || (c->width <= centre.x)) {
    _Var1 = find_space(&centre_local,L'\v',L'\x19');
    if (!_Var1) {
      return false;
    }
    centre = (loc_conflict)((ulong)centre_local & 0xffffffff);
    wVar9 = centre_local.y;
  }
  iVar7 = centre.x;
  generate_room(c,wVar9 + L'\xfffffffb',iVar7 + L'\xfffffff4',wVar9 + L'\x05',iVar7 + L'\f',
                (uint)(wVar4 <= uVar2 + L'\x01'));
  draw_rectangle(c,wVar9 + L'\xfffffffb',iVar7 + L'\xfffffff4',wVar9 + L'\x05',iVar7 + L'\f',
                 FEAT_GRANITE,L'\f',false);
  fill_rectangle(c,wVar9 + L'\xfffffffc',iVar7 + L'\xfffffff5',wVar9 + L'\x04',iVar7 + L'\v',
                 FEAT_FLOOR,L'\0');
  wVar6 = wVar9 + L'\xfffffffd';
  wVar4 = iVar7 + L'\xfffffff6';
  wVar8 = wVar9 + L'\x03';
  wVar10 = iVar7 + L'\n';
  flag = L'\v';
  draw_rectangle(c,wVar6,wVar4,wVar8,wVar10,FEAT_GRANITE,L'\v',false);
  uVar2 = Rand_div(5);
  if (uVar2 < 5) {
    y1 = wVar9 + L'\xfffffffe';
    switch(uVar2) {
    case 0:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"plain");
      generate_hole(c,wVar6,wVar4,wVar8,wVar10,FEAT_CLOSED);
      vault_monsters((chunk_conflict *)c,centre_local,c->depth + L'\x02',L'\x01');
      return true;
    case 1:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"nested");
      generate_hole(c,wVar6,wVar4,wVar8,wVar10,FEAT_CLOSED);
      wVar4 = wVar9 + L'\xffffffff';
      wVar6 = iVar7 + L'\xffffffff';
      wVar9 = wVar9 + L'\x01';
      wVar8 = iVar7 + L'\x01';
      draw_rectangle(c,wVar4,wVar6,wVar9,wVar8,FEAT_GRANITE,L'\v',false);
      generate_hole(c,wVar4,wVar6,wVar9,wVar8,FEAT_CLOSED);
      for (; wVar10 = wVar6, wVar4 <= wVar9; wVar4 = wVar4 + L'\x01') {
        for (; wVar10 <= wVar8; wVar10 = wVar10 + L'\x01') {
          grid = (loc)loc(wVar10,wVar4);
          _Var1 = square_iscloseddoor((chunk_conflict *)c,grid);
          if (_Var1) {
            uVar2 = Rand_div(7);
            square_set_door_lock(c,grid,uVar2 + L'\x01');
          }
        }
      }
      wVar4 = c->depth;
      uVar2 = Rand_div(3);
      lVar3 = centre_local;
      vault_monsters((chunk_conflict *)c,centre_local,wVar4 + L'\x02',uVar2 + L'\x03');
      uVar2 = Rand_div(100);
      if (((int)uVar2 < 0x50) || (dun->persist == true)) {
        place_object((chunk_conflict *)c,lVar3,c->depth,false,false,'\x03',L'\0');
      }
      else {
        place_random_stairs((chunk_conflict *)c,lVar3);
      }
      uVar2 = Rand_div(3);
      vault_traps((chunk_conflict *)c,lVar3,L'\x04',L'\n',uVar2 + L'\x03');
      return true;
    case 2:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pillar");
      generate_hole(c,wVar6,wVar4,wVar8,wVar10,FEAT_CLOSED);
      wVar6 = wVar9 + L'\xffffffff';
      wVar4 = wVar9 + L'\x01';
      fill_rectangle(c,wVar6,iVar7 + L'\xffffffff',wVar4,iVar7 + L'\x01',FEAT_GRANITE,L'\v');
      uVar2 = Rand_div(2);
      if (uVar2 == 0) {
        uVar2 = Rand_div(2);
        uVar11 = (uint)(uVar2 == 0);
        fill_rectangle(c,wVar6,(iVar7 - uVar11) + L'\xfffffffa',wVar4,
                       (iVar7 - uVar11) + L'\xfffffffc',FEAT_GRANITE,L'\v');
        fill_rectangle(c,wVar6,iVar7 + uVar11 + L'\x04',wVar4,iVar7 + 6 + uVar11,FEAT_GRANITE,L'\v')
        ;
      }
      uVar2 = Rand_div(3);
      if (uVar2 == 0) {
        draw_rectangle(c,wVar6,iVar7 + L'\xfffffffb',wVar4,iVar7 + L'\x05',FEAT_GRANITE,L'\v',false)
        ;
        uVar2 = Rand_div(2);
        lVar3 = loc(iVar7 + -3,wVar6 + uVar2 * 2);
        place_secret_door((chunk_conflict *)c,lVar3);
        uVar2 = Rand_div(2);
        lVar3 = loc(iVar7 + 3,wVar6 + uVar2 * 2);
        place_secret_door((chunk_conflict *)c,lVar3);
        lVar3 = loc(iVar7 + -2,wVar9);
        wVar4 = c->depth;
        uVar2 = Rand_div(2);
        vault_monsters((chunk_conflict *)c,lVar3,wVar4 + L'\x02',uVar2 + L'\x01');
        lVar3 = loc(iVar7 + 2,wVar9);
        wVar4 = c->depth;
        uVar2 = Rand_div(2);
        vault_monsters((chunk_conflict *)c,lVar3,wVar4 + L'\x02',uVar2 + L'\x01');
        uVar2 = Rand_div(3);
        if (uVar2 == 0) {
          lVar3 = loc(iVar7 + -2,wVar9);
          place_object((chunk_conflict *)c,lVar3,c->depth,false,false,'\x03',L'\0');
        }
        uVar2 = Rand_div(3);
        if (uVar2 != 0) {
          return true;
        }
        lVar3 = loc(iVar7 + 2,wVar9);
        place_object((chunk_conflict *)c,lVar3,c->depth,false,false,'\x03',L'\0');
        return true;
      }
      break;
    case 3:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"checkerboard");
      generate_hole(c,wVar6,wVar4,wVar8,wVar10,FEAT_CLOSED);
      uVar11 = (iVar7 + wVar9) - 0xb;
      for (; uVar12 = uVar11, wVar4 = iVar7 + L'\xfffffff7', y1 <= wVar9 + L'\x02';
          y1 = y1 + L'\x01') {
        for (; wVar4 <= iVar7 + L'\t'; wVar4 = wVar4 + L'\x01') {
          if ((uVar12 & 1) != 0) {
            lVar3 = loc(wVar4,y1);
            set_marked_granite(c,lVar3,L'\v');
          }
          uVar12 = uVar12 + 1;
        }
        uVar11 = uVar11 + 1;
      }
      lVar3 = loc(iVar7 + -5,wVar9);
      wVar4 = c->depth;
      uVar2 = Rand_div(3);
      vault_monsters((chunk_conflict *)c,lVar3,wVar4 + L'\x02',uVar2 + L'\x01');
      lVar3 = loc(iVar7 + 5,wVar9);
      wVar4 = c->depth;
      uVar2 = Rand_div(3);
      vault_monsters((chunk_conflict *)c,lVar3,wVar4 + L'\x02',uVar2 + L'\x01');
      lVar3 = loc(iVar7 + -3,wVar9);
      uVar2 = Rand_div(3);
      vault_traps((chunk_conflict *)c,lVar3,L'\x02',L'\b',uVar2 + L'\x01');
      lVar3 = loc(iVar7 + 3,wVar9);
      uVar2 = Rand_div(3);
      vault_traps((chunk_conflict *)c,lVar3,L'\x02',L'\b',uVar2 + L'\x01');
      vault_objects((chunk_conflict *)c,centre_local,c->depth,L'\x03');
      break;
    case 4:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"compartments");
      generate_plus(c,y1,iVar7 + L'\xfffffff7',wVar9 + L'\x02',iVar7 + L'\t',FEAT_GRANITE,flag);
      uVar2 = Rand_div(100);
      if ((int)uVar2 < 0x32) {
        uVar2 = Rand_div(10);
        iVar5 = iVar7 - (uVar2 + 1);
        lVar3 = loc(iVar5,wVar6);
        place_closed_door((chunk_conflict *)c,lVar3);
        wVar10 = uVar2 + iVar7 + L'\x01';
        lVar3 = loc(wVar10,wVar6);
        place_closed_door((chunk_conflict *)c,lVar3);
        lVar3 = loc(iVar5,wVar8);
        place_closed_door((chunk_conflict *)c,lVar3);
      }
      else {
        uVar2 = Rand_div(3);
        iVar7 = uVar2 + wVar9 + 1;
        lVar3 = loc(wVar4,iVar7);
        place_closed_door((chunk_conflict *)c,lVar3);
        wVar8 = wVar9 - (uVar2 + 1);
        lVar3 = loc(wVar4,wVar8);
        place_closed_door((chunk_conflict *)c,lVar3);
        lVar3 = loc(wVar10,iVar7);
        place_closed_door((chunk_conflict *)c,lVar3);
      }
      lVar3 = loc(wVar10,wVar8);
      place_closed_door((chunk_conflict *)c,lVar3);
      wVar4 = c->depth;
      uVar2 = Rand_div(2);
      lVar3 = centre_local;
      vault_objects((chunk_conflict *)c,centre_local,wVar4,uVar2 + L'\x03');
      iVar7 = lVar3.x + -4;
      grid_00 = loc(iVar7,wVar9 + L'\x01');
      wVar4 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters((chunk_conflict *)c,grid_00,wVar4 + L'\x02',uVar2 + L'\x01');
      iVar5 = lVar3.x + 4;
      lVar3 = loc(iVar5,wVar9 + L'\x01');
      wVar4 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters((chunk_conflict *)c,lVar3,wVar4 + L'\x02',uVar2 + L'\x01');
      lVar3 = loc(iVar7,wVar9 + L'\xffffffff');
      wVar4 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters((chunk_conflict *)c,lVar3,wVar4 + L'\x02',uVar2 + L'\x01');
      lVar3 = loc(iVar5,wVar9 + L'\xffffffff');
      wVar4 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters((chunk_conflict *)c,lVar3,wVar4 + L'\x02',uVar2 + L'\x01');
    }
    return true;
  }
  return true;
}

Assistant:

bool build_large(struct chunk *c, struct loc centre, int rating)
{
	int y, x, y1, x1, y2, x2;
	int height = 9;
	int width = 23;

	int light = false;

	/* Occasional light */
	if (c->depth <= randint1(25)) light = true;

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Large room */
	y1 = centre.y - height / 2;
	y2 = centre.y + height / 2;
	x1 = centre.x - width / 2;
	x2 = centre.x + width / 2;

	/* Generate new room */
	generate_room(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, light);

	/* Generate outer walls */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);

	/* Generate inner floors */
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	/* The inner room */
	y1 = y1 + 2;
	y2 = y2 - 2;
	x1 = x1 + 2;
	x2 = x2 - 2;

	/* Generate inner walls */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_INNER, false);

	/* Inner room variations */
	switch (randint1(5)) {
		/* An inner room */
	case 1: {
		/* Open the inner room with a door and place a monster */
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "plain");
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);
		vault_monsters(c, centre, c->depth + 2, 1);
		break;
	}


		/* An inner room with a small inner room */
	case 2: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "nested");

		/* Open the inner room with a door */
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

		/* Place another inner room */
		draw_rectangle(c, centre.y - 1, centre.x - 1, centre.y + 1,
			centre.x + 1, FEAT_GRANITE, SQUARE_WALL_INNER, false);

		/* Open the inner room with a locked door */
		generate_hole(c, centre.y - 1, centre.x - 1, centre.y + 1, centre.x + 1,
					  FEAT_CLOSED);
		for (y = centre.y - 1; y <= centre.y + 1; y++) {
			for (x = centre.x - 1; x <= centre.x + 1; x++) {
				struct loc grid = loc(x, y);
				if (square_iscloseddoor(c, grid)) {
					square_set_door_lock(c, grid, randint1(7));
				}
			}
		}

		/* Monsters to guard the treasure */
		vault_monsters(c, centre, c->depth + 2, randint1(3) + 2);

		/* Object (80%) or Stairs (20%) */
		if (randint0(100) < 80 || dun->persist) {
			place_object(c, centre, c->depth, false, false, ORIGIN_SPECIAL, 0);
		} else {
			place_random_stairs(c, centre);
		}

		/* Traps to protect the treasure */
		vault_traps(c, centre, 4, 10, 2 + randint1(3));

		break;
	}


		/* An inner room with an inner pillar or pillars */
	case 3: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "pillar");

		/* Open the inner room with a secret door */
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

		/* Inner pillar */
		fill_rectangle(c, centre.y - 1, centre.x - 1, centre.y + 1,
					   centre.x + 1, FEAT_GRANITE, SQUARE_WALL_INNER);

		/* Occasionally, two more Large Inner Pillars */
		if (one_in_(2)) {
			if (one_in_(2)) {
				fill_rectangle(c, centre.y - 1, centre.x - 7, centre.y + 1,
							   centre.x - 5, FEAT_GRANITE, SQUARE_WALL_INNER);
				fill_rectangle(c, centre.y - 1, centre.x + 5, centre.y + 1,
							   centre.x + 7, FEAT_GRANITE, SQUARE_WALL_INNER);
			} else {
				fill_rectangle(c, centre.y - 1, centre.x - 6, centre.y + 1,
							   centre.x - 4, FEAT_GRANITE, SQUARE_WALL_INNER);
				fill_rectangle(c, centre.y - 1, centre.x + 4, centre.y + 1,
							   centre.x + 6, FEAT_GRANITE, SQUARE_WALL_INNER);
			}
		}

		/* Occasionally, some Inner rooms */
		if (one_in_(3)) {
			/* Inner rectangle */
			draw_rectangle(c, centre.y - 1, centre.x - 5, centre.y + 1,
				centre.x + 5, FEAT_GRANITE,
				SQUARE_WALL_INNER, false);

			/* Secret doors (random top/bottom) */
			place_secret_door(c, loc(centre.x - 3,
									 centre.y - 3 + (randint1(2) * 2)));
			place_secret_door(c, loc(centre.x + 3,
									 centre.y - 3 + (randint1(2) * 2)));

			/* Monsters */
			vault_monsters(c, loc(centre.x - 2, centre.y), c->depth + 2,
						   randint1(2));
			vault_monsters(c, loc(centre.x + 2, centre.y), c->depth + 2,
						   randint1(2));

			/* Objects */
			if (one_in_(3))
				place_object(c, loc(centre.x - 2, centre.y), c->depth, false,
							 false, ORIGIN_SPECIAL, 0);
			if (one_in_(3))
				place_object(c, loc(centre.x + 2, centre.y), c->depth, false,
							 false, ORIGIN_SPECIAL, 0);
		}

		break;
	}


		/* An inner room with a checkerboard */
	case 4: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"checkerboard");

		/* Open the inner room with a secret door */
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

		/* Checkerboard */
		for (y = y1; y <= y2; y++)
			for (x = x1; x <= x2; x++)
				if ((x + y) & 0x01)
					set_marked_granite(c, loc(x, y), SQUARE_WALL_INNER);

		/* Monsters just love mazes. */
		vault_monsters(c, loc(centre.x - 5, centre.y), c->depth + 2,
					   randint1(3));
		vault_monsters(c, loc(centre.x + 5, centre.y), c->depth + 2,
					   randint1(3));

		/* Traps make them entertaining. */
		vault_traps(c, loc(centre.x - 3, centre.y), 2, 8, randint1(3));
		vault_traps(c, loc(centre.x + 3, centre.y), 2, 8, randint1(3));

		/* Mazes should have some treasure too. */
		vault_objects(c, centre, c->depth, 3);

		break;
	}


		/* Four small rooms. */
	case 5: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"compartments");

		/* Inner "cross" */
		generate_plus(c, y1, x1, y2, x2, FEAT_GRANITE, SQUARE_WALL_INNER);

		/* Doors into the rooms */
		if (randint0(100) < 50) {
			int i = randint1(10);
			place_closed_door(c, loc(centre.x - i, y1 - 1));
			place_closed_door(c, loc(centre.x + i, y1 - 1));
			place_closed_door(c, loc(centre.x - i, y2 + 1));
			place_closed_door(c, loc(centre.x + i, y2 + 1));
		} else {
			int i = randint1(3);
			place_closed_door(c, loc(x1 - 1, centre.y + i));
			place_closed_door(c, loc(x1 - 1, centre.y - i));
			place_closed_door(c, loc(x2 + 1, centre.y + i));
			place_closed_door(c, loc(x2 + 1, centre.y - i));
		}

		/* Treasure, centered at the center of the cross */
		vault_objects(c, centre, c->depth, 2 + randint1(2));

		/* Gotta have some monsters */
		vault_monsters(c, loc(centre.x - 4, centre.y + 1), c->depth + 2,
					   randint1(4));
		vault_monsters(c, loc(centre.x + 4, centre.y + 1), c->depth + 2,
					   randint1(4));
		vault_monsters(c, loc(centre.x - 4, centre.y - 1), c->depth + 2,
					   randint1(4));
		vault_monsters(c, loc(centre.x + 4, centre.y - 1), c->depth + 2,
					   randint1(4)); 

		break;
	}
	}

	return true;
}